

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Quaternion QVar10;
  
  fVar5 = to.z;
  fVar3 = to.x;
  fVar4 = to.y;
  fVar2 = from.z;
  fVar1 = from.x;
  fVar8 = from.y;
  fVar9 = fVar8 * fVar5 - fVar4 * fVar2;
  fVar7 = fVar2 * fVar3 - fVar5 * fVar1;
  fVar6 = fVar4 * fVar1 - fVar8 * fVar3;
  fVar8 = fVar2 * fVar5 + fVar1 * fVar3 + fVar8 * fVar4 + 1.0;
  fVar1 = fVar8 * fVar8 + fVar6 * fVar6 + fVar9 * fVar9 + fVar7 * fVar7;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 | ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1))
  ;
  QVar10.y = fVar7 * fVar1;
  QVar10.x = fVar9 * fVar1;
  QVar10.w = fVar8 * fVar1;
  QVar10.z = fVar6 * fVar1;
  return QVar10;
}

Assistant:

RMDEF Quaternion QuaternionFromVector3ToVector3(Vector3 from, Vector3 to)
{
    Quaternion result = { 0 };

    float cos2Theta = Vector3DotProduct(from, to);
    Vector3 cross = Vector3CrossProduct(from, to);

    result.x = cross.x;
    result.y = cross.y;
    result.z = cross.z;
    result.w = 1.0f + cos2Theta;     // NOTE: Added QuaternioIdentity()

    // Normalize to essentially nlerp the original and identity to 0.5
    result = QuaternionNormalize(result);

    // Above lines are equivalent to:
    //Quaternion result = QuaternionNlerp(q, QuaternionIdentity(), 0.5f);

    return result;
}